

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  byte bVar4;
  byte bVar5;
  Index IVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  bool bVar10;
  
  iVar1 = *(int *)this;
  iVar2 = *(int *)(this + 0x70);
  if (iVar1 == 2) {
    bVar4 = 3;
  }
  else if (iVar1 == 1) {
    bVar4 = 1;
  }
  else if (iVar1 == 0) {
    IVar6 = BindingHash::FindIndex(&module->table_bindings,(Var *)(this + 0x28));
    bVar4 = (IVar6 != 0) * '\x02';
  }
  else {
    bVar4 = 0;
  }
  if (iVar2 != -0x10) {
    bVar10 = false;
    goto LAB_00177658;
  }
  piVar8 = *(int **)(this + 0x90);
  piVar3 = *(int **)(this + 0x98);
  lVar9 = ((long)piVar3 - (long)piVar8 >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  piVar7 = piVar8;
  if (0 < lVar9) {
    piVar7 = piVar8 + lVar9 * 0x58;
    lVar9 = lVar9 + 1;
    piVar8 = piVar8 + 0x2c;
    do {
      if (piVar8[-0x2c] != 1) {
        piVar8 = piVar8 + -0x2c;
        goto LAB_00177652;
      }
      if (piVar8[-0x16] != 1) {
        piVar8 = piVar8 + -0x16;
        goto LAB_00177652;
      }
      if (*piVar8 != 1) goto LAB_00177652;
      if (piVar8[0x16] != 1) {
        piVar8 = piVar8 + 0x16;
        goto LAB_00177652;
      }
      lVar9 = lVar9 + -1;
      piVar8 = piVar8 + 0x58;
    } while (1 < lVar9);
  }
  lVar9 = ((long)piVar3 - (long)piVar7 >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (lVar9 == 1) {
LAB_0017762f:
    piVar8 = piVar7;
    if (*piVar7 == 1) {
      piVar8 = piVar3;
    }
  }
  else if (lVar9 == 2) {
LAB_00177626:
    piVar8 = piVar7;
    if (*piVar7 == 1) {
      piVar7 = piVar7 + 0x16;
      goto LAB_0017762f;
    }
  }
  else {
    piVar8 = piVar3;
    if ((lVar9 == 3) && (piVar8 = piVar7, *piVar7 == 1)) {
      piVar7 = piVar7 + 0x16;
      goto LAB_00177626;
    }
  }
LAB_00177652:
  bVar10 = piVar8 == piVar3;
LAB_00177658:
  bVar5 = bVar4 | 4;
  if (bVar10) {
    bVar5 = bVar4;
  }
  return bVar5;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  bool all_ref_func = elem_type == Type::FuncRef;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  all_ref_func = all_ref_func &&
                 std::all_of(elem_exprs.begin(), elem_exprs.end(),
                             [](const ElemExpr& elem_expr) {
                               return elem_expr.kind == ElemExprKind::RefFunc;
                             });
  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}